

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::insertData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLCh *dat)

{
  undefined8 target;
  bool bVar1;
  int iVar2;
  DOMNodeImpl *this_00;
  XMLSize_t XVar3;
  DOMException *pDVar4;
  XMLSize_t maxChars;
  ulong uVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  undefined4 extraout_var_00;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_01;
  DOMRangeImpl *this_02;
  long lVar7;
  long *local_20d0;
  MemoryManager *local_20b0;
  MemoryManager *local_2098;
  ulong local_2078;
  XMLSize_t i;
  XMLSize_t sz;
  Ranges *ranges;
  DOMDocumentImpl *doc;
  XMLCh temp [4096];
  XMLCh *newString;
  XMLSize_t newLen;
  XMLSize_t datLen;
  XMLSize_t len;
  XMLCh *dat_local;
  XMLSize_t offset_local;
  DOMNode *node_local;
  DOMCharacterDataImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(node);
  bVar1 = DOMNodeImpl::isReadOnly(this_00);
  if (bVar1) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      local_2098 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      local_2098 = DOMDocumentImpl::getMemoryManager(this->fDoc);
    }
    DOMException::DOMException(pDVar4,7,0,local_2098);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  XVar3 = DOMBuffer::getLen(this->fDataBuf);
  if (offset <= XVar3) {
    maxChars = XMLString::stringLen(dat);
    uVar5 = XVar3 + maxChars;
    if (uVar5 < 0xfff) {
      temp._8184_8_ = &doc;
    }
    else {
      temp._8184_4_ =
           (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                     (XMLPlatformUtils::fgMemoryManager,(uVar5 + 1) * 2);
      temp._8188_4_ = extraout_var;
    }
    target = temp._8184_8_;
    pXVar6 = DOMBuffer::getRawBuffer(this->fDataBuf);
    XMLString::copyNString((XMLCh *)target,pXVar6,offset);
    XMLString::copyNString((XMLCh *)(temp._8184_8_ + offset * 2),dat,maxChars);
    lVar7 = temp._8184_8_ + offset * 2;
    pXVar6 = DOMBuffer::getRawBuffer(this->fDataBuf);
    XMLString::copyString((XMLCh *)(lVar7 + maxChars * 2),pXVar6 + offset);
    DOMBuffer::set(this->fDataBuf,(XMLCh *)temp._8184_8_);
    if (0xffe < uVar5) {
      (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[4])
                (XMLPlatformUtils::fgMemoryManager,temp._8184_8_);
    }
    iVar2 = (*node->_vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      local_20d0 = (long *)0x0;
    }
    else {
      local_20d0 = (long *)(CONCAT44(extraout_var_00,iVar2) + -8);
    }
    if (((local_20d0 != (long *)0x0) &&
        (this_01 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)
                   (**(code **)(*local_20d0 + 0x230))(),
        this_01 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0)) &&
       (XVar3 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::size(this_01), XVar3 != 0)) {
      for (local_2078 = 0; local_2078 < XVar3; local_2078 = local_2078 + 1) {
        this_02 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_01,local_2078);
        DOMRangeImpl::updateRangeForInsertedText(this_02,node,offset,maxChars);
      }
    }
    return;
  }
  pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDoc == (DOMDocumentImpl *)0x0) {
    local_20b0 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    local_20b0 = DOMDocumentImpl::getMemoryManager(this->fDoc);
  }
  DOMException::DOMException(pDVar4,1,0,local_20b0);
  __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::insertData(const DOMNode *node, XMLSize_t offset, const XMLCh *dat)
{
    if (castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //

    XMLSize_t len = fDataBuf->getLen();
    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    XMLSize_t datLen = XMLString::stringLen(dat);

    XMLSize_t newLen = len + datLen;

    XMLCh* newString;
    XMLCh temp[4096];
    if (newLen >= 4095)
        newString = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
        (
            (newLen + 1) * sizeof(XMLCh)
        );//new XMLCh[newLen+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer(), offset);
    XMLString::copyNString(newString+offset, dat, datLen);
    XMLString::copyString(newString+offset+datLen, fDataBuf->getRawBuffer()+offset);

    fDataBuf->set(newString);

    if (newLen >= 4095)
        XMLPlatformUtils::fgMemoryManager->deallocate(newString);//delete[] newString;

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();
    if (doc != 0) {
        Ranges* ranges = doc->getRanges();
        if (ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateRangeForInsertedText( (DOMNode*)node, offset, datLen);
                }
            }
        }
    }
}